

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

optional<double> __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeF64(ParseInput *this)

{
  undefined4 uVar1;
  optional<double> oVar2;
  undefined1 local_68 [8];
  optional<wasm::WATParser::Token> t;
  
  peek((optional<wasm::WATParser::Token> *)local_68,this);
  if (t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index == '\x01') {
    oVar2 = Token::getF64((Token *)local_68);
    t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._64_8_ =
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_payload;
    uVar1 = oVar2.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._8_4_;
    if (((undefined1  [16])
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar1 = 0;
    }
    else {
      Lexer::operator++(&this->lexer);
    }
  }
  else {
    uVar1 = 0;
  }
  std::_Optional_payload_base<wasm::WATParser::Token>::_M_reset
            ((_Optional_payload_base<wasm::WATParser::Token> *)local_68);
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_4_ = uVar1;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)
               t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
               super__Optional_payload_base<wasm::WATParser::Token>._64_8_;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  return (optional<double>)
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double> takeF64() {
    if (auto t = peek()) {
      if (auto d = t->getF64()) {
        ++lexer;
        return d;
      }
    }
    return std::nullopt;
  }